

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmimgrb.cpp
# Opt level: O0

void CVmObjDict::rebuild_cb_2(void *ctx0,CVmHashEntry *entry0)

{
  undefined1 *puVar1;
  void *__dest;
  uint i;
  size_t sVar2;
  char *__src;
  CVmHashEntryDict *in_RSI;
  long in_RDI;
  size_t rem;
  char *p;
  size_t cnt;
  vm_dict_entry *cur;
  CVmHashEntryDict *entry;
  rebuild_ctx *ctx;
  size_t local_40;
  byte *local_38;
  vm_dict_entry *local_28;
  
  i = 0;
  for (local_28 = CVmHashEntryDict::get_head(in_RSI); local_28 != (vm_dict_entry *)0x0;
      local_28 = local_28->nxt_) {
    i = i + 1;
  }
  sVar2 = CVmHashEntry::getlen((CVmHashEntry *)in_RSI);
  puVar1 = *(undefined1 **)(in_RDI + 0x10);
  *(undefined1 **)(in_RDI + 0x10) = puVar1 + 1;
  *puVar1 = (char)sVar2;
  __dest = *(void **)(in_RDI + 0x10);
  __src = CVmHashEntry::getstr((CVmHashEntry *)in_RSI);
  sVar2 = CVmHashEntry::getlen((CVmHashEntry *)in_RSI);
  memcpy(__dest,__src,sVar2);
  local_38 = *(byte **)(in_RDI + 0x10);
  for (local_40 = CVmHashEntry::getlen((CVmHashEntry *)in_RSI); local_40 != 0;
      local_40 = local_40 - 1) {
    *local_38 = *local_38 ^ 0xbd;
    local_38 = local_38 + 1;
  }
  sVar2 = CVmHashEntry::getlen((CVmHashEntry *)in_RSI);
  *(size_t *)(in_RDI + 0x10) = sVar2 + *(long *)(in_RDI + 0x10);
  ::oswp2(*(void **)(in_RDI + 0x10),i);
  *(long *)(in_RDI + 0x10) = *(long *)(in_RDI + 0x10) + 2;
  for (local_28 = CVmHashEntryDict::get_head(in_RSI); local_28 != (vm_dict_entry *)0x0;
      local_28 = local_28->nxt_) {
    ::oswp4(*(void **)(in_RDI + 0x10),(ulong)local_28->obj_);
    ::oswp2((void *)(*(long *)(in_RDI + 0x10) + 4),(uint)local_28->prop_);
    *(long *)(in_RDI + 0x10) = *(long *)(in_RDI + 0x10) + 6;
  }
  return;
}

Assistant:

void CVmObjDict::rebuild_cb_2(void *ctx0, class CVmHashEntry *entry0)
{
    rebuild_ctx *ctx = (rebuild_ctx *)ctx0;
    CVmHashEntryDict *entry = (CVmHashEntryDict *)entry0;
    vm_dict_entry *cur;
    size_t cnt;
    char *p;
    size_t rem;

    /* count the entries in our list */
    for (cnt = 0, cur = entry->get_head() ; cur != 0 ;
         cur = cur->nxt_, ++cnt) ;

    /* write the length of the key string followed by the key string */
    *ctx->dst++ = (char)entry->getlen();
    memcpy(ctx->dst, entry->getstr(), entry->getlen());

    /* xor the key string's bytes */
    for (p = ctx->dst, rem = entry->getlen() ; rem != 0 ;
         --rem, ++p)
        *p ^= 0xBD;

    /* move past the key string */
    ctx->dst += entry->getlen();

    /* write the item count */
    oswp2(ctx->dst, cnt);
    ctx->dst += 2;

    /* write the items */
    for (cur = entry->get_head() ; cur != 0 ; cur = cur->nxt_)
    {
        /* write the object ID and property ID for this item */
        oswp4(ctx->dst, (ulong)cur->obj_);
        oswp2(ctx->dst + 4, (uint)cur->prop_);
        ctx->dst += 6;
    }
}